

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

int libtorrent::path_compare(string_view lhs,string_view lfile,string_view rhs,string_view rfile)

{
  int iVar1;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  string_view p;
  string_view p_00;
  string_view p_01;
  string_view p_02;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_c8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a8;
  size_t local_80;
  char *local_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_70;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  
  p._M_str = lfile._M_str;
  local_80 = lfile._M_len;
  p._M_len = (size_t)lhs._M_str;
  local_78 = p._M_str;
  lsplit_path(&local_a8,(libtorrent *)lhs._M_len,p);
  p_00._M_str = p._M_str;
  p_00._M_len = (size_t)rhs._M_str;
  lsplit_path(&local_c8,(libtorrent *)rhs._M_len,p_00);
  do {
    if (local_a8.first._M_len == 0) {
      if (local_c8.first._M_len == 0) {
        iVar1 = 0;
      }
      else {
        local_a8.first._M_len = local_80;
        local_a8.first._M_str = local_78;
LAB_0021d8dd:
        __str_00._M_str = local_c8.first._M_str;
        __str_00._M_len = local_c8.first._M_len;
        iVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::compare
                          (&local_a8.first,__str_00);
      }
      return iVar1;
    }
    if (local_c8.first._M_len == 0) {
      local_c8.first._M_len = rfile._M_len;
      local_c8.first._M_str = rfile._M_str;
      goto LAB_0021d8dd;
    }
    __str._M_str = local_c8.first._M_str;
    __str._M_len = local_c8.first._M_len;
    iVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_a8.first,__str);
    if (iVar1 != 0) {
      return iVar1;
    }
    p_01._M_str = p._M_str;
    p_01._M_len = (size_t)local_a8.second._M_str;
    lsplit_path(&local_50,(libtorrent *)local_a8.second._M_len,p_01);
    local_a8.first._M_len = local_50.first._M_len;
    local_a8.first._M_str = local_50.first._M_str;
    local_a8.second._M_len = local_50.second._M_len;
    local_a8.second._M_str = local_50.second._M_str;
    p_02._M_str = p._M_str;
    p_02._M_len = (size_t)local_c8.second._M_str;
    lsplit_path(&local_70,(libtorrent *)local_c8.second._M_len,p_02);
    local_c8.first._M_len = local_70.first._M_len;
    local_c8.first._M_str = local_70.first._M_str;
    local_c8.second._M_len = local_70.second._M_len;
    local_c8.second._M_str = local_70.second._M_str;
  } while( true );
}

Assistant:

int path_compare(string_view const lhs, string_view const lfile
		, string_view const rhs, string_view const rfile)
	{
		for (auto lhs_elems = lsplit_path(lhs), rhs_elems = lsplit_path(rhs);
			!lhs_elems.first.empty() || !rhs_elems.first.empty();
			lhs_elems = lsplit_path(lhs_elems.second), rhs_elems = lsplit_path(rhs_elems.second))
		{
			if (lhs_elems.first.empty() || rhs_elems.first.empty())
			{
				if (lhs_elems.first.empty()) lhs_elems.first = lfile;
				if (rhs_elems.first.empty()) rhs_elems.first = rfile;
				return lhs_elems.first.compare(rhs_elems.first);
			}

			int const ret = lhs_elems.first.compare(rhs_elems.first);
			if (ret != 0) return ret;
		}
		return 0;
	}